

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O3

bool __thiscall draco::PointCloudDecoder::DecodePointAttributes(PointCloudDecoder *this)

{
  long lVar1;
  byte bVar2;
  DecoderBuffer *pDVar3;
  pointer puVar4;
  AttributesDecoderInterface *pAVar5;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  _Var6;
  char cVar7;
  int iVar8;
  int iVar9;
  pointer piVar10;
  uint uVar11;
  ulong uVar12;
  unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  *att_dec;
  pointer puVar13;
  ulong uVar14;
  int iVar15;
  
  pDVar3 = this->buffer_;
  lVar1 = pDVar3->pos_ + 1;
  if (lVar1 <= pDVar3->data_size_) {
    bVar2 = pDVar3->data_[pDVar3->pos_];
    uVar12 = (ulong)bVar2;
    pDVar3->pos_ = lVar1;
    if (bVar2 != 0) {
      uVar11 = 0;
      do {
        iVar8 = (*this->_vptr_PointCloudDecoder[4])(this,(ulong)uVar11);
        if ((char)iVar8 == '\0') {
          return false;
        }
        uVar11 = uVar11 + 1;
      } while (bVar2 != uVar11);
    }
    puVar4 = (this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar13 = (this->attributes_decoders_).
                   super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar4;
        puVar13 = puVar13 + 1) {
      pAVar5 = (puVar13->_M_t).
               super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
               .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl;
      iVar8 = (*pAVar5->_vptr_AttributesDecoderInterface[2])(pAVar5,this,this->point_cloud_);
      if ((char)iVar8 == '\0') {
        return false;
      }
    }
    if (uVar12 != 0) {
      uVar14 = 0;
      do {
        _Var6._M_t.
        super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
             (this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_t.
             super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
             ._M_t;
        cVar7 = (**(code **)(*(long *)_Var6._M_t.
                                      super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                      .
                                      super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                      ._M_head_impl + 0x18))
                          (_Var6._M_t.
                           super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                           .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                           _M_head_impl,this->buffer_);
        if (cVar7 == '\0') {
          return false;
        }
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
      if (uVar12 != 0) {
        uVar12 = 0;
        do {
          iVar8 = (**(code **)(*(long *)(this->attributes_decoders_).
                                        super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_t.
                                        super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                                        ._M_t + 0x30))();
          if (0 < iVar8) {
            iVar15 = 0;
            do {
              _Var6._M_t.
              super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
              .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
                   (this->attributes_decoders_).
                   super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_t.
                   super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                   ._M_t;
              iVar9 = (**(code **)(*(long *)_Var6._M_t.
                                            super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                            .
                                            super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                            ._M_head_impl + 0x28))
                                (_Var6._M_t.
                                 super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                 .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                                 _M_head_impl,iVar15);
              piVar10 = (this->attribute_to_decoder_map_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((ulong)((long)(this->attribute_to_decoder_map_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar10 >> 2) <=
                  (ulong)(long)iVar9) {
                std::vector<int,_std::allocator<int>_>::resize
                          (&this->attribute_to_decoder_map_,(long)(iVar9 + 1));
                piVar10 = (this->attribute_to_decoder_map_).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              piVar10[iVar9] = (int)uVar12;
              iVar15 = iVar15 + 1;
            } while (iVar8 != iVar15);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != (uint)bVar2);
      }
    }
    iVar8 = (*this->_vptr_PointCloudDecoder[7])(this);
    if ((char)iVar8 != '\0') {
      iVar8 = (*this->_vptr_PointCloudDecoder[8])(this);
      return SUB41(iVar8,0);
    }
  }
  return false;
}

Assistant:

bool PointCloudDecoder::DecodePointAttributes() {
  uint8_t num_attributes_decoders;
  if (!buffer_->Decode(&num_attributes_decoders)) {
    return false;
  }
  // Create all attribute decoders. This is implementation specific and the
  // derived classes can use any data encoded in the
  // PointCloudEncoder::EncodeAttributesEncoderIdentifier() call.
  for (int i = 0; i < num_attributes_decoders; ++i) {
    if (!CreateAttributesDecoder(i)) {
      return false;
    }
  }

  // Initialize all attributes decoders. No data is decoded here.
  for (auto &att_dec : attributes_decoders_) {
    if (!att_dec->Init(this, point_cloud_)) {
      return false;
    }
  }

  // Decode any data needed by the attribute decoders.
  for (int i = 0; i < num_attributes_decoders; ++i) {
    if (!attributes_decoders_[i]->DecodeAttributesDecoderData(buffer_)) {
      return false;
    }
  }

  // Create map between attribute and decoder ids.
  for (int i = 0; i < num_attributes_decoders; ++i) {
    const int32_t num_attributes = attributes_decoders_[i]->GetNumAttributes();
    for (int j = 0; j < num_attributes; ++j) {
      int att_id = attributes_decoders_[i]->GetAttributeId(j);
      if (att_id >= attribute_to_decoder_map_.size()) {
        attribute_to_decoder_map_.resize(att_id + 1);
      }
      attribute_to_decoder_map_[att_id] = i;
    }
  }

  // Decode the actual attributes using the created attribute decoders.
  if (!DecodeAllAttributes()) {
    return false;
  }

  if (!OnAttributesDecoded()) {
    return false;
  }
  return true;
}